

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

void __thiscall Js::DynamicObject::SetIsPrototype(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  DynamicTypeHandler *pDVar6;
  DynamicType *pDVar7;
  ArrayObject *pAVar8;
  undefined4 *puVar9;
  DynamicType *pDVar10;
  ScriptContext *requestContext;
  bool bVar11;
  ArrayObject *objectArray;
  bool wasPrototype;
  bool wasShared;
  DynamicType *oldType;
  DynamicTypeHandler *currentTypeHandler;
  DynamicObject *this_local;
  
  pDVar6 = GetTypeHandler(this);
  pDVar7 = GetDynamicType(this);
  bVar2 = DynamicTypeHandler::GetIsShared(pDVar6);
  bVar3 = DynamicTypeHandler::GetFlags(pDVar6);
  bVar11 = (bVar3 & 0x20) != 0;
  bVar4 = DynamicTypeHandler::IsolatePrototypes();
  if ((((bVar4) && (uVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x54])(), (uVar5 & 1) != 0)) &&
      (bVar4 = DynamicTypeHandler::GetIsOrMayBecomeShared(pDVar6), bVar4)) && (bVar11)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x2aa,
                                "(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared() || !wasPrototype)"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared() || !wasPrototype"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar3 = DynamicTypeHandler::GetFlags(pDVar6);
  if ((bVar3 & 0x30) == 0x20) {
    pAVar8 = GetObjectArray(this);
    if (pAVar8 != (ArrayObject *)0x0) {
      pAVar8 = GetObjectArray(this);
      pDVar6 = GetTypeHandler(&pAVar8->super_DynamicObject);
      bVar3 = DynamicTypeHandler::GetFlags(pDVar6);
      if ((bVar3 & 0x20) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                    ,0x2b1,
                                    "(this->GetObjectArray() == nullptr || (this->GetObjectArray()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0)"
                                    ,
                                    "this->GetObjectArray() == nullptr || (this->GetObjectArray()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
  }
  else {
    (*pDVar6->_vptr_DynamicTypeHandler[0x52])(pDVar6,this);
    pDVar6 = GetTypeHandler(this);
    pAVar8 = GetObjectArray(this);
    if (pAVar8 != (ArrayObject *)0x0) {
      (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[100])();
    }
    uVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x53])();
    if ((uVar5 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x2c1,"(currentTypeHandler->SupportsPrototypeInstances())",
                                  "currentTypeHandler->SupportsPrototypeInstances()");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar4 = DynamicTypeHandler::IsolatePrototypes();
    if (((bVar4) && (uVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x54])(), (uVar5 & 1) != 0)) &&
       (bVar4 = DynamicTypeHandler::GetIsOrMayBecomeShared(pDVar6), bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x2c2,
                                  "(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared())"
                                  ,
                                  "!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared()"
                                 );
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if (((!bVar11) || (bVar2)) &&
       ((bVar2 = DynamicTypeHandler::ChangeTypeOnProto(), bVar2 &&
        ((uVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x55])(), (uVar5 & 1) != 0 &&
         (pDVar10 = GetDynamicType(this), pDVar10 == pDVar7)))))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x2c3,
                                  "((wasPrototype && !wasShared) || !DynamicTypeHandler::ChangeTypeOnProto() || !currentTypeHandler->RespectsChangeTypeOnProto() || this->GetDynamicType() != oldType)"
                                  ,
                                  "(wasPrototype && !wasShared) || !DynamicTypeHandler::ChangeTypeOnProto() || !currentTypeHandler->RespectsChangeTypeOnProto() || this->GetDynamicType() != oldType"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pDVar10 = GetDynamicType(this);
    if (pDVar10 == pDVar7) {
      requestContext = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
      DynamicTypeHandler::InvalidateStoreFieldCachesForAllProperties(pDVar6,requestContext);
    }
  }
  return;
}

Assistant:

void DynamicObject::SetIsPrototype()
    {
        DynamicTypeHandler* currentTypeHandler = this->GetTypeHandler();
        Js::DynamicType* oldType = this->GetDynamicType();

#if DBG
        bool wasShared = currentTypeHandler->GetIsShared();
        bool wasPrototype = (currentTypeHandler->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0;
        Assert(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared() || !wasPrototype);
#endif

        // If this handler is not shared and it already has a prototype flag then we must have taken the required
        // type transition (if any) earlier when the singleton object first became a prototype.
        if ((currentTypeHandler->GetFlags() & (DynamicTypeHandler::IsSharedFlag | DynamicTypeHandler::IsPrototypeFlag)) == DynamicTypeHandler::IsPrototypeFlag)
        {
            Assert(this->GetObjectArray() == nullptr || (this->GetObjectArray()->GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag) != 0);
            return;
        }

        currentTypeHandler->SetIsPrototype(this);
        // Get type handler again, in case it got changed by SetIsPrototype.
        currentTypeHandler = this->GetTypeHandler();

        // Set the object array as a prototype as well, so if it is an ES5 array, we will disable the array set element fast path
        ArrayObject * objectArray = this->GetObjectArray();
        if (objectArray)
        {
            objectArray->SetIsPrototype();
        }

#if DBG
        Assert(currentTypeHandler->SupportsPrototypeInstances());
        Assert(!DynamicTypeHandler::IsolatePrototypes() || !currentTypeHandler->RespectsIsolatePrototypes() || !currentTypeHandler->GetIsOrMayBecomeShared());
        Assert((wasPrototype && !wasShared) || !DynamicTypeHandler::ChangeTypeOnProto() || !currentTypeHandler->RespectsChangeTypeOnProto() || this->GetDynamicType() != oldType);
#endif

        // If we haven't changed type we must explicitly invalidate store field inline caches to avoid properties
        // getting added to this prototype object on the fast path without proper invalidation.
        if (this->GetDynamicType() == oldType)
        {
            currentTypeHandler->InvalidateStoreFieldCachesForAllProperties(this->GetScriptContext());
        }
    }